

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmatrix.cpp
# Opt level: O2

int __thiscall TPZMatrix<int>::MatrixNorm(TPZMatrix<int> *this,int p,int64_t numiter,REAL tol)

{
  long rows;
  bool bVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  ostream *poVar5;
  int *piVar6;
  long lVar7;
  long lVar8;
  int sum;
  long lVar9;
  long lVar10;
  double dVar11;
  TPZVec<int> ROW;
  TPZVec<int> EigenVal;
  TPZFMatrix<int> transp;
  REAL local_110;
  int64_t local_108;
  TPZVec<int> local_100;
  TPZVec<int> local_e0;
  TPZFMatrix<int> local_c0;
  
  rows = (this->super_TPZBaseMatrix).fRow;
  iVar3 = 0;
  if (rows != 0) {
    local_110 = tol;
    local_108 = numiter;
    if (rows != (this->super_TPZBaseMatrix).fCol) {
      poVar5 = std::operator<<((ostream *)&std::cerr,
                               "TVar TPZMatrix<int>::MatrixNorm(int, int64_t, REAL) const [T = int]"
                              );
      poVar5 = std::operator<<(poVar5," - matrix must be square - Rows() = ");
      poVar5 = std::ostream::_M_insert<long>((long)poVar5);
      poVar5 = std::operator<<(poVar5," - Cols() = ");
      poVar5 = std::ostream::_M_insert<long>((long)poVar5);
      std::endl<char,std::char_traits<char>>(poVar5);
    }
    if (p == 0) {
      iVar3 = 0;
      lVar7 = 0;
      if (0 < rows) {
        lVar7 = rows;
      }
      for (lVar9 = 0; lVar9 != lVar7; lVar9 = lVar9 + 1) {
        dVar11 = 0.0;
        for (lVar10 = 0; rows != lVar10; lVar10 = lVar10 + 1) {
          iVar2 = (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x21])
                            (this,lVar9,lVar10);
          dVar11 = dVar11 + ABS((double)iVar2);
        }
        if (ABS((double)iVar3) < dVar11) {
          iVar3 = (int)dVar11;
        }
      }
    }
    else if (p == 2) {
      TPZFMatrix<int>::TPZFMatrix(&local_c0,rows,rows);
      lVar9 = 0;
      lVar7 = 0;
      if (0 < rows) {
        lVar7 = rows;
      }
      for (; lVar9 != lVar7; lVar9 = lVar9 + 1) {
        for (lVar10 = 0; rows != lVar10; lVar10 = lVar10 + 1) {
          iVar3 = (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x21])
                            (this,lVar10,lVar9);
          piVar6 = TPZFMatrix<int>::operator()(&local_c0,lVar9,lVar10);
          *piVar6 = iVar3;
        }
      }
      TPZVec<int>::TPZVec(&local_100,rows);
      for (lVar9 = 0; lVar9 != lVar7; lVar9 = lVar9 + 1) {
        for (lVar10 = 0; rows != lVar10; lVar10 = lVar10 + 1) {
          piVar6 = TPZFMatrix<int>::operator()(&local_c0,lVar9,lVar10);
          local_100.fStore[lVar10] = *piVar6;
        }
        for (lVar10 = 0; lVar10 != rows; lVar10 = lVar10 + 1) {
          iVar3 = 0;
          for (lVar8 = 0; rows != lVar8; lVar8 = lVar8 + 1) {
            iVar2 = local_100.fStore[lVar8];
            iVar4 = (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x21])
                              (this,lVar8,lVar10);
            iVar3 = iVar3 + iVar4 * iVar2;
          }
          piVar6 = TPZFMatrix<int>::operator()(&local_c0,lVar9,lVar10);
          *piVar6 = iVar3;
        }
      }
      local_e0._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01649228;
      local_e0.fStore = (int *)0x0;
      local_e0.fNElements = 0;
      local_e0.fNAlloc = 0;
      bVar1 = SolveEigenvaluesJacobi(&local_c0.super_TPZMatrix<int>,&local_108,&local_110,&local_e0)
      ;
      if (!bVar1) {
        poVar5 = std::operator<<((ostream *)&std::cerr,
                                 "TVar TPZMatrix<int>::MatrixNorm(int, int64_t, REAL) const [T = int]"
                                );
        poVar5 = std::operator<<(poVar5," - it was not possible to find Eigenvalues. Iterations = ")
        ;
        poVar5 = std::ostream::_M_insert<long>((long)poVar5);
        std::operator<<(poVar5," - error found = ");
        poVar5 = std::ostream::_M_insert<double>(local_110);
        std::endl<char,std::char_traits<char>>(poVar5);
      }
      dVar11 = (double)*local_e0.fStore;
      if (dVar11 < 0.0) {
        dVar11 = sqrt(dVar11);
      }
      else {
        dVar11 = SQRT(dVar11);
      }
      iVar3 = (int)dVar11;
      TPZVec<int>::~TPZVec(&local_e0);
      TPZVec<int>::~TPZVec(&local_100);
      TPZFMatrix<int>::~TPZFMatrix(&local_c0);
    }
    else if (p == 1) {
      iVar3 = 0;
      lVar7 = 0;
      if (0 < rows) {
        lVar7 = rows;
      }
      for (lVar9 = 0; lVar9 != lVar7; lVar9 = lVar9 + 1) {
        dVar11 = 0.0;
        for (lVar10 = 0; rows != lVar10; lVar10 = lVar10 + 1) {
          iVar2 = (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x21])
                            (this,lVar10,lVar9);
          dVar11 = dVar11 + ABS((double)iVar2);
        }
        if (ABS((double)iVar3) < dVar11) {
          iVar3 = (int)dVar11;
        }
      }
    }
    else {
      poVar5 = std::operator<<((ostream *)&std::cerr,
                               "TVar TPZMatrix<int>::MatrixNorm(int, int64_t, REAL) const [T = int]"
                              );
      poVar5 = std::operator<<(poVar5," p = ");
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,p);
      poVar5 = std::operator<<(poVar5," is not a correct option");
      std::endl<char,std::char_traits<char>>(poVar5);
      iVar3 = 0;
    }
  }
  return iVar3;
}

Assistant:

TVar TPZMatrix<TVar>::MatrixNorm(int p, int64_t numiter, REAL tol) const{
	const int64_t n = this->Rows();
	if (!n) return 0.;
	if (n != this->Cols()){
		PZError << __PRETTY_FUNCTION__
		<< " - matrix must be square - Rows() = "
		<< this->Rows() << " - Cols() = "
		<< this->Cols() << std::endl;
	}
	switch(p){
		case 0:{
			TVar max = 0.;
			int64_t i, j;
			for(i = 0; i < n; i++){
				REAL sum = 0.;
				for(j = 0; j < n; j++) sum += fabs( this->Get(i,j) );
				if (sum > fabs(max)) max = sum;
			}
			return max;
		}
		case 1:{
			TVar max = 0.;
			int64_t i, j;
			for(i = 0; i < n; i++){
				REAL sum = 0.;
				for(j = 0; j < n; j++) sum += fabs( this->Get(j,i) );
				if (sum > fabs(max)) max = sum;
			}
			return max;
		}
		case 2:{
			TPZFMatrix<TVar> transp(n,n);
			int64_t i, j, k;
			//TRANSPOSE
			for(i = 0; i < n; i++) for(j = 0; j < n; j++) transp(i,j) = this->Get(j,i);
			//MULTIPLY transp = transp.this
			TPZVec<TVar> ROW(n);
			for(i = 0; i < n; i++){
				for(j = 0; j < n; j++) ROW[j] = transp(i,j);
				for(j = 0; j < n; j++){
					TVar sum = 0.;
					for(k = 0; k < n; k++){
						sum += ROW[k] * this->Get(k,j);
					}//for k
					transp(i,j) = sum;
				}//for j
			}//for i
			
			TPZVec<TVar> EigenVal;
			bool result = transp.SolveEigenvaluesJacobi(numiter, tol, &EigenVal);
			if (result == false) PZError << __PRETTY_FUNCTION__
				<< " - it was not possible to find Eigenvalues. Iterations = "
				<< numiter << " - error found = " << tol << std::endl;
			return sqrt(EigenVal[0]);
		}//case 2
		default:{
			PZError << __PRETTY_FUNCTION__ << " p = " << p << " is not a correct option" << std::endl;
		}
	}//switch
	return 0.;
}